

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexTextureTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::VertexTextureTests::init(VertexTextureTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 wrapS;
  Context *pCVar1;
  TestCaseGroup *this_00;
  TestCaseGroup *this_01;
  TestCaseGroup *this_02;
  TestCaseGroup *this_03;
  TestCaseGroup *this_04;
  TestCaseGroup *this_05;
  TestCaseGroup *this_06;
  TestCaseGroup *this_07;
  TestCaseGroup *this_08;
  TestCaseGroup *this_09;
  TestCaseGroup *this_10;
  TestCaseGroup *this_11;
  ulong extraout_RAX;
  Vertex2DTextureCase *pVVar2;
  char *pcVar3;
  ulong uVar4;
  VertexCubeTextureCase *pVVar5;
  Vertex2DArrayTextureCase *pVVar6;
  Vertex3DTextureCase *pVVar7;
  allocator<char> local_641;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_640;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0;
  undefined1 local_5a0 [8];
  string name_7;
  int wrapRMode;
  int wrapTMode_3;
  int wrapSMode_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  undefined1 local_4d0 [8];
  string name_6;
  int wrapMode_3;
  int magFilter_3;
  int minFilter_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  undefined1 local_440 [8];
  string name_5;
  uint local_418;
  int wrapTMode_2;
  int wrapSMode_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  undefined1 local_370 [8];
  string name_4;
  int wrapMode_2;
  int magFilter_2;
  int minFilter_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  undefined1 local_2e0 [8];
  string name_3;
  uint local_2b8;
  int wrapTMode_1;
  int wrapSMode_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  undefined1 local_210 [8];
  string name_2;
  int wrapMode_1;
  int magFilter_1;
  int minFilter_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  undefined1 local_180 [8];
  string name_1;
  uint local_158;
  int wrapTMode;
  int wrapSMode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_b0 [8];
  string name;
  int local_88;
  int wrapMode;
  int magFilter;
  int minFilter;
  TestCaseGroup *wrapGroup3D;
  TestCaseGroup *filteringGroup3D;
  TestCaseGroup *wrapGroup2DArray;
  TestCaseGroup *filteringGroup2DArray;
  TestCaseGroup *wrapGroupCube;
  TestCaseGroup *filteringGroupCube;
  TestCaseGroup *wrapGroup2D;
  TestCaseGroup *filteringGroup2D;
  TestCaseGroup *group3D;
  TestCaseGroup *group2DArray;
  TestCaseGroup *groupCube;
  TestCaseGroup *group2D;
  VertexTextureTests *this_local;
  
  this_00 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_00,(this->super_TestCaseGroup).m_context,"2d","2D Vertex Texture Tests");
  this_01 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_01,(this->super_TestCaseGroup).m_context,"cube","Cube Map Vertex Texture Tests");
  this_02 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_02,(this->super_TestCaseGroup).m_context,"2d_array",
             "2D Array Vertex Texture Tests");
  this_03 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_03,(this->super_TestCaseGroup).m_context,"3d","3D Vertex Texture Tests");
  this_04 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_04,(this->super_TestCaseGroup).m_context,"filtering",
             "2D Vertex Texture Filtering Tests");
  this_05 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_05,(this->super_TestCaseGroup).m_context,"wrap","2D Vertex Texture Wrap Tests");
  this_06 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_06,(this->super_TestCaseGroup).m_context,"filtering",
             "Cube Map Vertex Texture Filtering Tests");
  this_07 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_07,(this->super_TestCaseGroup).m_context,"wrap",
             "Cube Map Vertex Texture Wrap Tests");
  this_08 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_08,(this->super_TestCaseGroup).m_context,"filtering",
             "2D Array Vertex Texture Filtering Tests");
  this_09 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_09,(this->super_TestCaseGroup).m_context,"wrap",
             "2D Array Vertex Texture Wrap Tests");
  this_10 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_10,(this->super_TestCaseGroup).m_context,"filtering",
             "3D Vertex Texture Filtering Tests");
  this_11 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_11,(this->super_TestCaseGroup).m_context,"wrap","3D Vertex Texture Wrap Tests");
  tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)this_04);
  tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)this_05);
  tcu::TestNode::addChild((TestNode *)this_01,(TestNode *)this_06);
  tcu::TestNode::addChild((TestNode *)this_01,(TestNode *)this_07);
  tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)this_08);
  tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)this_09);
  tcu::TestNode::addChild((TestNode *)this_03,(TestNode *)this_10);
  tcu::TestNode::addChild((TestNode *)this_03,(TestNode *)this_11);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_02);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_03);
  wrapMode = 0;
  uVar4 = extraout_RAX;
  while (wrapMode < 6) {
    for (local_88 = 0; local_88 < 2; local_88 = local_88 + 1) {
      for (name.field_2._12_4_ = 0; (int)name.field_2._12_4_ < 3;
          name.field_2._12_4_ = name.field_2._12_4_ + 1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&wrapSMode,"",(allocator<char> *)((long)&wrapTMode + 3));
        std::operator+(&local_130,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &wrapSMode,init::minFilterModes[wrapMode].name);
        std::operator+(&local_110,&local_130,"_");
        std::operator+(&local_f0,&local_110,init::magFilterModes[local_88].name);
        std::operator+(&local_d0,&local_f0,"_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0
                       ,&local_d0,init::wrapModes[(int)name.field_2._12_4_].name);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&wrapSMode);
        std::allocator<char>::~allocator((allocator<char> *)((long)&wrapTMode + 3));
        pVVar2 = (Vertex2DTextureCase *)operator_new(0xa0);
        pCVar1 = (this->super_TestCaseGroup).m_context;
        pcVar3 = (char *)std::__cxx11::string::c_str();
        Vertex2DTextureCase::Vertex2DTextureCase
                  (pVVar2,pCVar1,pcVar3,"",init::minFilterModes[wrapMode].mode,
                   init::magFilterModes[local_88].mode,
                   init::wrapModes[(int)name.field_2._12_4_].mode,
                   init::wrapModes[(int)name.field_2._12_4_].mode);
        tcu::TestNode::addChild((TestNode *)this_04,(TestNode *)pVVar2);
        std::__cxx11::string::~string((string *)local_b0);
      }
    }
    wrapMode = wrapMode + 1;
    uVar4 = (ulong)(uint)wrapMode;
  }
  local_158 = 0;
  while ((int)local_158 < 3) {
    for (name_1.field_2._12_4_ = 0; (int)name_1.field_2._12_4_ < 3;
        name_1.field_2._12_4_ = name_1.field_2._12_4_ + 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&minFilter_1,"",(allocator<char> *)((long)&magFilter_1 + 3));
      std::operator+(&local_1c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &minFilter_1,init::wrapModes[(int)local_158].name);
      std::operator+(&local_1a0,&local_1c0,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180,
                     &local_1a0,init::wrapModes[(int)name_1.field_2._12_4_].name);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&minFilter_1);
      std::allocator<char>::~allocator((allocator<char> *)((long)&magFilter_1 + 3));
      pVVar2 = (Vertex2DTextureCase *)operator_new(0xa0);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      pcVar3 = (char *)std::__cxx11::string::c_str();
      Vertex2DTextureCase::Vertex2DTextureCase
                (pVVar2,pCVar1,pcVar3,"",0x2703,0x2601,init::wrapModes[(int)local_158].mode,
                 init::wrapModes[(int)name_1.field_2._12_4_].mode);
      tcu::TestNode::addChild((TestNode *)this_05,(TestNode *)pVVar2);
      std::__cxx11::string::~string((string *)local_180);
    }
    local_158 = local_158 + 1;
    uVar4 = (ulong)local_158;
  }
  wrapMode_1 = 0;
  while (wrapMode_1 < 6) {
    for (name_2.field_2._12_4_ = 0; (int)name_2.field_2._12_4_ < 2;
        name_2.field_2._12_4_ = name_2.field_2._12_4_ + 1) {
      for (name_2.field_2._8_4_ = 0; (int)name_2.field_2._8_4_ < 3;
          name_2.field_2._8_4_ = name_2.field_2._8_4_ + 1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&wrapSMode_1,"",(allocator<char> *)((long)&wrapTMode_1 + 3));
        std::operator+(&local_290,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &wrapSMode_1,init::minFilterModes[wrapMode_1].name);
        std::operator+(&local_270,&local_290,"_");
        std::operator+(&local_250,&local_270,init::magFilterModes[(int)name_2.field_2._12_4_].name);
        std::operator+(&local_230,&local_250,"_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_210,&local_230,init::wrapModes[(int)name_2.field_2._8_4_].name);
        std::__cxx11::string::~string((string *)&local_230);
        std::__cxx11::string::~string((string *)&local_250);
        std::__cxx11::string::~string((string *)&local_270);
        std::__cxx11::string::~string((string *)&local_290);
        std::__cxx11::string::~string((string *)&wrapSMode_1);
        std::allocator<char>::~allocator((allocator<char> *)((long)&wrapTMode_1 + 3));
        pVVar5 = (VertexCubeTextureCase *)operator_new(0xa0);
        pCVar1 = (this->super_TestCaseGroup).m_context;
        pcVar3 = (char *)std::__cxx11::string::c_str();
        VertexCubeTextureCase::VertexCubeTextureCase
                  (pVVar5,pCVar1,pcVar3,"",init::minFilterModes[wrapMode_1].mode,
                   init::magFilterModes[(int)name_2.field_2._12_4_].mode,
                   init::wrapModes[(int)name_2.field_2._8_4_].mode,
                   init::wrapModes[(int)name_2.field_2._8_4_].mode);
        tcu::TestNode::addChild((TestNode *)this_06,(TestNode *)pVVar5);
        std::__cxx11::string::~string((string *)local_210);
      }
    }
    wrapMode_1 = wrapMode_1 + 1;
    uVar4 = (ulong)(uint)wrapMode_1;
  }
  local_2b8 = 0;
  while ((int)local_2b8 < 3) {
    for (name_3.field_2._12_4_ = 0; (int)name_3.field_2._12_4_ < 3;
        name_3.field_2._12_4_ = name_3.field_2._12_4_ + 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&minFilter_2,"",(allocator<char> *)((long)&magFilter_2 + 3));
      std::operator+(&local_320,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &minFilter_2,init::wrapModes[(int)local_2b8].name);
      std::operator+(&local_300,&local_320,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e0,
                     &local_300,init::wrapModes[(int)name_3.field_2._12_4_].name);
      std::__cxx11::string::~string((string *)&local_300);
      std::__cxx11::string::~string((string *)&local_320);
      std::__cxx11::string::~string((string *)&minFilter_2);
      std::allocator<char>::~allocator((allocator<char> *)((long)&magFilter_2 + 3));
      pVVar5 = (VertexCubeTextureCase *)operator_new(0xa0);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      pcVar3 = (char *)std::__cxx11::string::c_str();
      VertexCubeTextureCase::VertexCubeTextureCase
                (pVVar5,pCVar1,pcVar3,"",0x2703,0x2601,init::wrapModes[(int)local_2b8].mode,
                 init::wrapModes[(int)name_3.field_2._12_4_].mode);
      tcu::TestNode::addChild((TestNode *)this_07,(TestNode *)pVVar5);
      std::__cxx11::string::~string((string *)local_2e0);
    }
    local_2b8 = local_2b8 + 1;
    uVar4 = (ulong)local_2b8;
  }
  wrapMode_2 = 0;
  while (wrapMode_2 < 6) {
    for (name_4.field_2._12_4_ = 0; (int)name_4.field_2._12_4_ < 2;
        name_4.field_2._12_4_ = name_4.field_2._12_4_ + 1) {
      for (name_4.field_2._8_4_ = 0; (int)name_4.field_2._8_4_ < 3;
          name_4.field_2._8_4_ = name_4.field_2._8_4_ + 1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&wrapSMode_2,"",(allocator<char> *)((long)&wrapTMode_2 + 3));
        std::operator+(&local_3f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &wrapSMode_2,init::minFilterModes[wrapMode_2].name);
        std::operator+(&local_3d0,&local_3f0,"_");
        std::operator+(&local_3b0,&local_3d0,init::magFilterModes[(int)name_4.field_2._12_4_].name);
        std::operator+(&local_390,&local_3b0,"_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_370,&local_390,init::wrapModes[(int)name_4.field_2._8_4_].name);
        std::__cxx11::string::~string((string *)&local_390);
        std::__cxx11::string::~string((string *)&local_3b0);
        std::__cxx11::string::~string((string *)&local_3d0);
        std::__cxx11::string::~string((string *)&local_3f0);
        std::__cxx11::string::~string((string *)&wrapSMode_2);
        std::allocator<char>::~allocator((allocator<char> *)((long)&wrapTMode_2 + 3));
        pVVar6 = (Vertex2DArrayTextureCase *)operator_new(0xa0);
        pCVar1 = (this->super_TestCaseGroup).m_context;
        pcVar3 = (char *)std::__cxx11::string::c_str();
        Vertex2DArrayTextureCase::Vertex2DArrayTextureCase
                  (pVVar6,pCVar1,pcVar3,"",init::minFilterModes[wrapMode_2].mode,
                   init::magFilterModes[(int)name_4.field_2._12_4_].mode,
                   init::wrapModes[(int)name_4.field_2._8_4_].mode,
                   init::wrapModes[(int)name_4.field_2._8_4_].mode);
        tcu::TestNode::addChild((TestNode *)this_08,(TestNode *)pVVar6);
        std::__cxx11::string::~string((string *)local_370);
      }
    }
    wrapMode_2 = wrapMode_2 + 1;
    uVar4 = (ulong)(uint)wrapMode_2;
  }
  local_418 = 0;
  while ((int)local_418 < 3) {
    for (name_5.field_2._12_4_ = 0; (int)name_5.field_2._12_4_ < 3;
        name_5.field_2._12_4_ = name_5.field_2._12_4_ + 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&minFilter_3,"",(allocator<char> *)((long)&magFilter_3 + 3));
      std::operator+(&local_480,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &minFilter_3,init::wrapModes[(int)local_418].name);
      std::operator+(&local_460,&local_480,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_440,
                     &local_460,init::wrapModes[(int)name_5.field_2._12_4_].name);
      std::__cxx11::string::~string((string *)&local_460);
      std::__cxx11::string::~string((string *)&local_480);
      std::__cxx11::string::~string((string *)&minFilter_3);
      std::allocator<char>::~allocator((allocator<char> *)((long)&magFilter_3 + 3));
      pVVar6 = (Vertex2DArrayTextureCase *)operator_new(0xa0);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      pcVar3 = (char *)std::__cxx11::string::c_str();
      Vertex2DArrayTextureCase::Vertex2DArrayTextureCase
                (pVVar6,pCVar1,pcVar3,"",0x2703,0x2601,init::wrapModes[(int)local_418].mode,
                 init::wrapModes[(int)name_5.field_2._12_4_].mode);
      tcu::TestNode::addChild((TestNode *)this_09,(TestNode *)pVVar6);
      std::__cxx11::string::~string((string *)local_440);
    }
    local_418 = local_418 + 1;
    uVar4 = (ulong)local_418;
  }
  wrapMode_3 = 0;
  while (wrapMode_3 < 6) {
    for (name_6.field_2._12_4_ = 0; (int)name_6.field_2._12_4_ < 2;
        name_6.field_2._12_4_ = name_6.field_2._12_4_ + 1) {
      for (name_6.field_2._8_4_ = 0; (int)name_6.field_2._8_4_ < 3;
          name_6.field_2._8_4_ = name_6.field_2._8_4_ + 1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&wrapSMode_3,"",(allocator<char> *)((long)&wrapTMode_3 + 3));
        std::operator+(&local_550,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &wrapSMode_3,init::minFilterModes[wrapMode_3].name);
        std::operator+(&local_530,&local_550,"_");
        std::operator+(&local_510,&local_530,init::magFilterModes[(int)name_6.field_2._12_4_].name);
        std::operator+(&local_4f0,&local_510,"_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_4d0,&local_4f0,init::wrapModes[(int)name_6.field_2._8_4_].name);
        std::__cxx11::string::~string((string *)&local_4f0);
        std::__cxx11::string::~string((string *)&local_510);
        std::__cxx11::string::~string((string *)&local_530);
        std::__cxx11::string::~string((string *)&local_550);
        std::__cxx11::string::~string((string *)&wrapSMode_3);
        std::allocator<char>::~allocator((allocator<char> *)((long)&wrapTMode_3 + 3));
        pVVar7 = (Vertex3DTextureCase *)operator_new(0xa8);
        pCVar1 = (this->super_TestCaseGroup).m_context;
        pcVar3 = (char *)std::__cxx11::string::c_str();
        wrapS = init::wrapModes[(int)name_6.field_2._8_4_].mode;
        Vertex3DTextureCase::Vertex3DTextureCase
                  (pVVar7,pCVar1,pcVar3,"",init::minFilterModes[wrapMode_3].mode,
                   init::magFilterModes[(int)name_6.field_2._12_4_].mode,wrapS,wrapS,wrapS);
        tcu::TestNode::addChild((TestNode *)this_10,(TestNode *)pVVar7);
        std::__cxx11::string::~string((string *)local_4d0);
      }
    }
    wrapMode_3 = wrapMode_3 + 1;
    uVar4 = (ulong)(uint)wrapMode_3;
  }
  wrapRMode = 0;
  while (wrapRMode < 3) {
    for (name_7.field_2._12_4_ = 0; (int)name_7.field_2._12_4_ < 3;
        name_7.field_2._12_4_ = name_7.field_2._12_4_ + 1) {
      for (name_7.field_2._8_4_ = 0; (int)name_7.field_2._8_4_ < 3;
          name_7.field_2._8_4_ = name_7.field_2._8_4_ + 1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_640,"",&local_641);
        std::operator+(&local_620,&local_640,init::wrapModes[wrapRMode].name);
        std::operator+(&local_600,&local_620,"_");
        std::operator+(&local_5e0,&local_600,init::wrapModes[(int)name_7.field_2._12_4_].name);
        std::operator+(&local_5c0,&local_5e0,"_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_5a0,&local_5c0,init::wrapModes[(int)name_7.field_2._8_4_].name);
        std::__cxx11::string::~string((string *)&local_5c0);
        std::__cxx11::string::~string((string *)&local_5e0);
        std::__cxx11::string::~string((string *)&local_600);
        std::__cxx11::string::~string((string *)&local_620);
        std::__cxx11::string::~string((string *)&local_640);
        std::allocator<char>::~allocator(&local_641);
        pVVar7 = (Vertex3DTextureCase *)operator_new(0xa8);
        pCVar1 = (this->super_TestCaseGroup).m_context;
        pcVar3 = (char *)std::__cxx11::string::c_str();
        Vertex3DTextureCase::Vertex3DTextureCase
                  (pVVar7,pCVar1,pcVar3,"",0x2703,0x2601,init::wrapModes[wrapRMode].mode,
                   init::wrapModes[(int)name_7.field_2._12_4_].mode,
                   init::wrapModes[(int)name_7.field_2._8_4_].mode);
        tcu::TestNode::addChild((TestNode *)this_11,(TestNode *)pVVar7);
        std::__cxx11::string::~string((string *)local_5a0);
      }
    }
    wrapRMode = wrapRMode + 1;
    uVar4 = (ulong)(uint)wrapRMode;
  }
  return (int)uVar4;
}

Assistant:

void VertexTextureTests::init (void)
{
	// 2D and cube map groups, and their filtering and wrap sub-groups.
	TestCaseGroup* const group2D				= new TestCaseGroup(m_context, "2d",			"2D Vertex Texture Tests");
	TestCaseGroup* const groupCube				= new TestCaseGroup(m_context, "cube",			"Cube Map Vertex Texture Tests");
	TestCaseGroup* const group2DArray			= new TestCaseGroup(m_context, "2d_array",		"2D Array Vertex Texture Tests");
	TestCaseGroup* const group3D				= new TestCaseGroup(m_context, "3d",			"3D Vertex Texture Tests");
	TestCaseGroup* const filteringGroup2D		= new TestCaseGroup(m_context, "filtering",		"2D Vertex Texture Filtering Tests");
	TestCaseGroup* const wrapGroup2D			= new TestCaseGroup(m_context, "wrap",			"2D Vertex Texture Wrap Tests");
	TestCaseGroup* const filteringGroupCube		= new TestCaseGroup(m_context, "filtering",		"Cube Map Vertex Texture Filtering Tests");
	TestCaseGroup* const wrapGroupCube			= new TestCaseGroup(m_context, "wrap",			"Cube Map Vertex Texture Wrap Tests");
	TestCaseGroup* const filteringGroup2DArray	= new TestCaseGroup(m_context, "filtering",		"2D Array Vertex Texture Filtering Tests");
	TestCaseGroup* const wrapGroup2DArray		= new TestCaseGroup(m_context, "wrap",			"2D Array Vertex Texture Wrap Tests");
	TestCaseGroup* const filteringGroup3D		= new TestCaseGroup(m_context, "filtering",		"3D Vertex Texture Filtering Tests");
	TestCaseGroup* const wrapGroup3D			= new TestCaseGroup(m_context, "wrap",			"3D Vertex Texture Wrap Tests");

	group2D->addChild(filteringGroup2D);
	group2D->addChild(wrapGroup2D);
	groupCube->addChild(filteringGroupCube);
	groupCube->addChild(wrapGroupCube);
	group2DArray->addChild(filteringGroup2DArray);
	group2DArray->addChild(wrapGroup2DArray);
	group3D->addChild(filteringGroup3D);
	group3D->addChild(wrapGroup3D);

	addChild(group2D);
	addChild(groupCube);
	addChild(group2DArray);
	addChild(group3D);

	static const struct
	{
		const char*		name;
		GLenum			mode;
	} wrapModes[] =
	{
		{ "clamp",		GL_CLAMP_TO_EDGE	},
		{ "repeat",		GL_REPEAT			},
		{ "mirror",		GL_MIRRORED_REPEAT	}
	};

	static const struct
	{
		const char*		name;
		GLenum			mode;
	} minFilterModes[] =
	{
		{ "nearest",				GL_NEAREST					},
		{ "linear",					GL_LINEAR					},
		{ "nearest_mipmap_nearest",	GL_NEAREST_MIPMAP_NEAREST	},
		{ "linear_mipmap_nearest",	GL_LINEAR_MIPMAP_NEAREST	},
		{ "nearest_mipmap_linear",	GL_NEAREST_MIPMAP_LINEAR	},
		{ "linear_mipmap_linear",	GL_LINEAR_MIPMAP_LINEAR		}
	};

	static const struct
	{
		const char*		name;
		GLenum			mode;
	} magFilterModes[] =
	{
		{ "nearest",	GL_NEAREST	},
		{ "linear",		GL_LINEAR	}
	};

#define FOR_EACH(ITERATOR, ARRAY, BODY)	\
	for (int (ITERATOR) = 0; (ITERATOR) < DE_LENGTH_OF_ARRAY(ARRAY); (ITERATOR)++)	\
		BODY

	// 2D cases.

	FOR_EACH(minFilter,		minFilterModes,
	FOR_EACH(magFilter,		magFilterModes,
	FOR_EACH(wrapMode,		wrapModes,
		{
			const string name = string("") + minFilterModes[minFilter].name + "_" + magFilterModes[magFilter].name + "_" + wrapModes[wrapMode].name;

			filteringGroup2D->addChild(new Vertex2DTextureCase(m_context,
															   name.c_str(), "",
															   minFilterModes[minFilter].mode,
															   magFilterModes[magFilter].mode,
															   wrapModes[wrapMode].mode,
															   wrapModes[wrapMode].mode));
		})));

	FOR_EACH(wrapSMode,		wrapModes,
	FOR_EACH(wrapTMode,		wrapModes,
		{
			const string name = string("") + wrapModes[wrapSMode].name + "_" + wrapModes[wrapTMode].name;

			wrapGroup2D->addChild(new Vertex2DTextureCase(m_context,
														  name.c_str(), "",
														  GL_LINEAR_MIPMAP_LINEAR,
														  GL_LINEAR,
														  wrapModes[wrapSMode].mode,
														  wrapModes[wrapTMode].mode));
		}));

	// Cube map cases.

	FOR_EACH(minFilter,		minFilterModes,
	FOR_EACH(magFilter,		magFilterModes,
	FOR_EACH(wrapMode,		wrapModes,
		{
			const string name = string("") + minFilterModes[minFilter].name + "_" + magFilterModes[magFilter].name + "_" + wrapModes[wrapMode].name;

			filteringGroupCube->addChild(new VertexCubeTextureCase(m_context,
																   name.c_str(), "",
																   minFilterModes[minFilter].mode,
																   magFilterModes[magFilter].mode,
																   wrapModes[wrapMode].mode,
																   wrapModes[wrapMode].mode));
		})));

	FOR_EACH(wrapSMode,		wrapModes,
	FOR_EACH(wrapTMode,		wrapModes,
		{
			const string name = string("") + wrapModes[wrapSMode].name + "_" + wrapModes[wrapTMode].name;

			wrapGroupCube->addChild(new VertexCubeTextureCase(m_context,
															  name.c_str(), "",
															  GL_LINEAR_MIPMAP_LINEAR,
															  GL_LINEAR,
															  wrapModes[wrapSMode].mode,
															  wrapModes[wrapTMode].mode));
		}));

	// 2D array cases.

	FOR_EACH(minFilter,		minFilterModes,
	FOR_EACH(magFilter,		magFilterModes,
	FOR_EACH(wrapMode,		wrapModes,
		{
			const string name = string("") + minFilterModes[minFilter].name + "_" + magFilterModes[magFilter].name + "_" + wrapModes[wrapMode].name;

			filteringGroup2DArray->addChild(new Vertex2DArrayTextureCase(m_context,
																		 name.c_str(), "",
																		 minFilterModes[minFilter].mode,
																		 magFilterModes[magFilter].mode,
																		 wrapModes[wrapMode].mode,
																		 wrapModes[wrapMode].mode));
		})));

	FOR_EACH(wrapSMode,		wrapModes,
	FOR_EACH(wrapTMode,		wrapModes,
		{
			const string name = string("") + wrapModes[wrapSMode].name + "_" + wrapModes[wrapTMode].name;

			wrapGroup2DArray->addChild(new Vertex2DArrayTextureCase(m_context,
																	name.c_str(), "",
																	GL_LINEAR_MIPMAP_LINEAR,
																	GL_LINEAR,
																	wrapModes[wrapSMode].mode,
																	wrapModes[wrapTMode].mode));
		}));

	// 3D cases.

	FOR_EACH(minFilter,		minFilterModes,
	FOR_EACH(magFilter,		magFilterModes,
	FOR_EACH(wrapMode,		wrapModes,
		{
			const string name = string("") + minFilterModes[minFilter].name + "_" + magFilterModes[magFilter].name + "_" + wrapModes[wrapMode].name;

			filteringGroup3D->addChild(new Vertex3DTextureCase(m_context,
															   name.c_str(), "",
															   minFilterModes[minFilter].mode,
															   magFilterModes[magFilter].mode,
															   wrapModes[wrapMode].mode,
															   wrapModes[wrapMode].mode,
															   wrapModes[wrapMode].mode));
		})));

	FOR_EACH(wrapSMode,		wrapModes,
	FOR_EACH(wrapTMode,		wrapModes,
	FOR_EACH(wrapRMode,		wrapModes,
		{
			const string name = string("") + wrapModes[wrapSMode].name + "_" + wrapModes[wrapTMode].name + "_" + wrapModes[wrapRMode].name;

			wrapGroup3D->addChild(new Vertex3DTextureCase(m_context,
														  name.c_str(), "",
														  GL_LINEAR_MIPMAP_LINEAR,
														  GL_LINEAR,
														  wrapModes[wrapSMode].mode,
														  wrapModes[wrapTMode].mode,
														  wrapModes[wrapRMode].mode));
		})));
}